

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O2

int gold_detect(obj *sobj,boolean *scr_known)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  byte bVar4;
  boolean bVar5;
  int iVar6;
  obj *poVar7;
  obj *poVar8;
  char *pcVar9;
  long lVar10;
  uint material;
  monst *pmVar12;
  byte bVar13;
  obj gold;
  ulong uVar11;
  
  bVar13 = 0;
  bVar4 = u._1052_1_ & 2;
  material = (*(int *)&sobj->field_0x4a << 0x1e) >> 0x1f & 0xf;
  uVar11 = (ulong)material;
  bVar5 = clear_stale_map('\f',material);
  *scr_known = bVar5;
  pmVar12 = (monst *)&level->monlist;
  while (pmVar12 = pmVar12->nmon, pmVar12 != (monst *)0x0) {
    if (0 < pmVar12->mhp) {
      poVar7 = findgold(pmVar12->minvent);
      if ((poVar7 != (obj *)0x0) || (iVar6 = monsndx(pmVar12->data), iVar6 == 0x103)) {
LAB_0015e2ad:
        *scr_known = '\x01';
        goto LAB_0015e2b8;
      }
      poVar7 = (obj *)&pmVar12->minvent;
      while (poVar7 = poVar7->nobj, poVar7 != (obj *)0x0) {
        if (((sobj->field_0x4a & 2) != 0) &&
           (poVar8 = o_material(poVar7,(uint)uVar11), poVar8 != (obj *)0x0)) goto LAB_0015e2ad;
        uVar11 = 0xc;
        poVar8 = o_in(poVar7,'\f');
        if (poVar8 != (obj *)0x0) goto LAB_0015e2ad;
      }
    }
  }
  poVar7 = (obj *)&level->objlist;
LAB_0015e4a7:
  do {
    poVar7 = poVar7->nobj;
    if (poVar7 == (obj *)0x0) {
      if (*scr_known != '\0') {
        if (bVar5 != '\0') {
          doredraw();
        }
        pcVar9 = body_part(5);
        pcVar9 = makeplural(pcVar9);
        pline("You notice some gold between your %s.",pcVar9);
        return 0;
      }
      if (youmonst.data == mons + 0x103) {
        pcVar9 = currency(2);
        sprintf((char *)&gold,"You feel like a million %s!",pcVar9);
      }
      else {
        lVar10 = hidden_gold();
        if ((lVar10 == 0) && (lVar10 = money_cnt(invent), lVar10 == 0)) {
          gold.cobj._0_2_ = 0x6c6c;
          gold.cobj._2_6_ = 0x726f6f702079;
          gold.o_id._0_2_ = 0x2e;
          gold.nobj = (obj *)0x6c65656620756f59;
          gold.v._0_2_ = 0x6d20;
          gold.v._2_6_ = 0x616972657461;
        }
        else {
          gold.olev = (level *)0x6e616e6966206572;
          gold._40_8_ = 0x746973206c616963;
          gold.cobj._0_2_ = 0x6120;
          gold.cobj._2_6_ = 0x792074756f62;
          gold.o_id._0_2_ = 0x756f;
          gold._26_6_ = 0x757475662072;
          gold.nobj = (obj *)0x6c65656620756f59;
          gold.v._0_2_ = 0x7720;
          gold.v._2_6_ = 0x64656972726f;
          gold.quan = 0x69746175;
          gold.spe = 'o';
          gold.oclass = 'n';
          gold.invlet = '.';
          gold.oartifact = '\0';
        }
      }
      strange_feeling(sobj,(char *)&gold);
      return 1;
    }
    if (((sobj->field_0x4a & 2) == 0) ||
       (poVar8 = o_material(poVar7,(uint)uVar11), poVar8 == (obj *)0x0)) {
      uVar11 = 0xc;
      poVar8 = o_in(poVar7,'\f');
      if (poVar8 == (obj *)0x0) goto LAB_0015e4a7;
    }
    *scr_known = '\x01';
    if ((poVar7->ox != u.ux) || (poVar7->oy != u.uy)) break;
  } while( true );
LAB_0015e2b8:
  cls();
  u._1052_1_ = u._1052_1_ & 0xfd;
  poVar7 = (obj *)&level->objlist;
LAB_0015e2dd:
  poVar7 = poVar7->nobj;
  if (poVar7 == (obj *)0x0) {
    pmVar12 = (monst *)&level->monlist;
LAB_0015e344:
    do {
      while( true ) {
        do {
          pmVar12 = pmVar12->nmon;
          if (pmVar12 == (monst *)0x0) {
            newsym((int)u.ux,(int)u.uy);
            pline("You feel very greedy, and sense gold!");
            exercise(2,'\x01');
            (*windowprocs.win_pause)(P_MAP);
            doredraw();
            u._1052_1_ = u._1052_1_ & 0xfd | bVar4;
            if (bVar4 != 0) {
              under_water(2);
            }
            if ((u._1052_1_ & 0x20) != 0) {
              under_ground(2);
            }
            return 0;
          }
        } while (pmVar12->mhp < 1);
        poVar7 = findgold(pmVar12->minvent);
        if ((poVar7 == (obj *)0x0) && (iVar6 = monsndx(pmVar12->data), iVar6 != 0x103)) break;
        poVar7 = &zeroobj;
        poVar8 = &gold;
        for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
          poVar8->nobj = poVar7->nobj;
          poVar7 = (obj *)((long)poVar7 + ((ulong)bVar13 * -2 + 1) * 8);
          poVar8 = (obj *)((long)poVar8 + (ulong)bVar13 * -0x10 + 8);
        }
        gold.ox = '\0';
        gold.oy = '\0';
        gold.otyp = 0x1ef;
        uVar3 = gold._40_8_;
        uVar1 = pmVar12->mx;
        uVar2 = pmVar12->my;
        gold.oy = uVar2;
        gold.ox = uVar1;
        gold._42_6_ = SUB86(uVar3,2);
        uVar11 = 1;
        map_object(&gold,1);
      }
      poVar7 = (obj *)&pmVar12->minvent;
      do {
        poVar7 = poVar7->nobj;
        if (poVar7 == (obj *)0x0) goto LAB_0015e344;
        if (((sobj->field_0x4a & 2) != 0) &&
           (poVar8 = o_material(poVar7,(uint)uVar11), poVar8 != (obj *)0x0)) break;
        uVar11 = 0xc;
        poVar8 = o_in(poVar7,'\f');
      } while (poVar8 == (obj *)0x0);
      poVar8->ox = pmVar12->mx;
      poVar8->oy = pmVar12->my;
      uVar11 = 1;
      map_object(poVar8,1);
    } while( true );
  }
  if (((sobj->field_0x4a & 2) == 0) ||
     (poVar8 = o_material(poVar7,(uint)uVar11), poVar8 == (obj *)0x0)) goto LAB_0015e2f8;
  goto LAB_0015e307;
LAB_0015e2f8:
  uVar11 = 0xc;
  poVar8 = o_in(poVar7,'\f');
  if (poVar8 != (obj *)0x0) {
LAB_0015e307:
    if (poVar8 != poVar7) {
      poVar8->ox = poVar7->ox;
      poVar8->oy = poVar7->oy;
    }
    uVar11 = 1;
    map_object(poVar8,1);
  }
  goto LAB_0015e2dd;
}

Assistant:

int gold_detect(struct obj *sobj, boolean *scr_known)
{
    struct obj *obj;
    struct monst *mtmp;
    int uw = u.uinwater;
    struct obj *temp;
    boolean stale;

    *scr_known = stale = clear_stale_map(COIN_CLASS, sobj->blessed ? GOLD : 0);

    /* look for gold carried by monsters (might be in a container) */
    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
    	if (DEADMONSTER(mtmp)) continue;	/* probably not needed in this case but... */
	if (findgold(mtmp->minvent) || monsndx(mtmp->data) == PM_GOLD_GOLEM) {
	    *scr_known = TRUE;
	    goto outgoldmap;	/* skip further searching */
	} else for (obj = mtmp->minvent; obj; obj = obj->nobj)
	    if (sobj->blessed && o_material(obj, GOLD)) {
	    	*scr_known = TRUE;
	    	goto outgoldmap;
	    } else if (o_in(obj, COIN_CLASS)) {
		*scr_known = TRUE;
		goto outgoldmap;	/* skip further searching */
	    }
    }
    
    /* look for gold objects */
    for (obj = level->objlist; obj; obj = obj->nobj) {
	if (sobj->blessed && o_material(obj, GOLD)) {
	    *scr_known = TRUE;
	    if (obj->ox != u.ux || obj->oy != u.uy) goto outgoldmap;
	} else if (o_in(obj, COIN_CLASS)) {
	    *scr_known = TRUE;
	    if (obj->ox != u.ux || obj->oy != u.uy) goto outgoldmap;
	}
    }

    if (!*scr_known) {
	/* no gold found on floor or monster's inventory.
	   adjust message if you have gold in your inventory */
	char buf[BUFSZ];
	if (youmonst.data == &mons[PM_GOLD_GOLEM]) {
		sprintf(buf, "You feel like a million %s!", currency(2L));
	} else if (hidden_gold() || money_cnt(invent))
		strcpy(buf, "You feel worried about your future financial situation.");
	else
		strcpy(buf, "You feel materially poor.");
	strange_feeling(sobj, buf);
	return 1;
    }
    /* only under me - no separate display required */
    if (stale) doredraw();
    pline("You notice some gold between your %s.", makeplural(body_part(FOOT)));
    return 0;

outgoldmap:
    cls();

    u.uinwater = 0;
    /* Discover gold locations. */
    for (obj = level->objlist; obj; obj = obj->nobj) {
    	if (sobj->blessed && (temp = o_material(obj, GOLD))) {
	    if (temp != obj) {
		temp->ox = obj->ox;
		temp->oy = obj->oy;
	    }
	    map_object(temp,1);
	} else if ((temp = o_in(obj, COIN_CLASS))) {
	    if (temp != obj) {
		temp->ox = obj->ox;
		temp->oy = obj->oy;
	    }
	    map_object(temp,1);
	}
    }
    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
    	if (DEADMONSTER(mtmp)) continue;	/* probably overkill here */
	if (findgold(mtmp->minvent) || monsndx(mtmp->data) == PM_GOLD_GOLEM) {
	    struct obj gold;
	    gold = zeroobj;
	    gold.otyp = GOLD_PIECE;
	    gold.ox = mtmp->mx;
	    gold.oy = mtmp->my;
	    map_object(&gold,1);
	} else for (obj = mtmp->minvent; obj; obj = obj->nobj)
	    if (sobj->blessed && (temp = o_material(obj, GOLD))) {
		temp->ox = mtmp->mx;
		temp->oy = mtmp->my;
		map_object(temp,1);
		break;
	    } else if ((temp = o_in(obj, COIN_CLASS))) {
		temp->ox = mtmp->mx;
		temp->oy = mtmp->my;
		map_object(temp,1);
		break;
	    }
    }
    
    newsym(u.ux,u.uy);
    pline("You feel very greedy, and sense gold!");
    exercise(A_WIS, TRUE);
    win_pause_output(P_MAP);
    doredraw();
    u.uinwater = uw;
    if (Underwater) under_water(2);
    if (u.uburied) under_ground(2);
    return 0;
}